

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

UnknownFieldOps * google::protobuf::internal::TcParser::GetUnknownFieldOps(TcParseTableBase *table)

{
  UnknownFieldOps *pUVar1;
  
  pUVar1 = (UnknownFieldOps *)
           (*table->fallback)((MessageLite *)0x0,(char *)0x0,(ParseContext *)0x0,(TcFieldData)0x0,
                              (TcParseTableBase *)0x0,0);
  return pUVar1;
}

Assistant:

const TcParser::UnknownFieldOps& TcParser::GetUnknownFieldOps(
    const TcParseTableBase* table) {
  // Call the fallback function in a special mode to only act as a
  // way to return the ops.
  // Hiding the unknown fields vtable behind the fallback function avoids adding
  // more pointers in TcParseTableBase, and the extra runtime jumps are not
  // relevant because unknown fields are rare.
  const char* ptr = table->fallback(nullptr, nullptr, nullptr, {}, nullptr, 0);
  return *reinterpret_cast<const UnknownFieldOps*>(ptr);
}